

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

string * verona::unquote(string *__return_storage_ptr__,string *s)

{
  char *pcVar1;
  ulong uVar2;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  uVar2 = s->_M_string_length;
  if (((uVar2 < 2) || (*pcVar1 != '\"')) || (pcVar1[uVar2 - 1] != '\"')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar2);
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,1,uVar2 - 2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string unquote(const std::string& s)
  {
    return ((s.size() >= 2) && (s[0] == '"') && (s[s.size() - 1] == '"')) ?
      s.substr(1, s.size() - 2) :
      s;
  }